

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  string *psVar4;
  undefined4 extraout_var;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string dir;
  long *local_160;
  undefined8 local_158;
  long local_150 [2];
  string local_140;
  undefined8 local_120;
  undefined1 *puStack_118;
  undefined1 local_110 [32];
  undefined8 local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [32];
  undefined8 local_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined8 local_80;
  undefined1 *puStack_78;
  undefined8 local_70;
  long *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  size_t local_50;
  char *local_48;
  undefined8 local_40;
  undefined1 *local_38;
  
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  sVar2 = psVar4->_M_string_length;
  puStack_118 = local_110;
  local_120 = 1;
  local_110[0] = 0x2f;
  (*gt->LocalGenerator->_vptr_cmLocalGenerator[0xe])(&local_160,gt->LocalGenerator,gt);
  iVar3 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x15])(this);
  local_80 = local_120;
  puStack_78 = puStack_118;
  local_70 = local_158;
  local_68 = local_160;
  local_b8 = local_b0;
  local_c0 = 1;
  local_b0[0] = 0x2f;
  local_60 = 1;
  local_90._M_len = sVar2;
  local_90._M_str = pcVar1;
  local_58 = local_b8;
  local_50 = strlen((char *)CONCAT44(extraout_var,iVar3));
  local_e8 = local_e0;
  local_f0 = 1;
  local_e0[0] = 0x2f;
  local_40 = 1;
  views._M_len = 6;
  views._M_array = &local_90;
  local_48 = (char *)CONCAT44(extraout_var,iVar3);
  local_38 = local_e8;
  cmCatViews_abi_cxx11_(&local_140,views);
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir = cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(),
                             '/', gt->LocalGenerator->GetTargetDirectory(gt),
                             '/', this->GetCMakeCFGIntDir(), '/');
  gt->ObjectDirectory = dir;
}